

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_primitive_types.h
# Opt level: O2

void dukglue::types::DukType<std::vector<Dog*,std::allocator<Dog*>>>::
     push<std::vector<Dog*,std::allocator<Dog*>>>
               (duk_context *ctx,vector<Dog_*,_std::allocator<Dog_*>_> *value)

{
  pointer ppDVar1;
  duk_idx_t obj_idx;
  size_t i;
  ulong uVar2;
  
  obj_idx = duk_push_array(ctx);
  for (uVar2 = 0;
      ppDVar1 = (value->super__Vector_base<Dog_*,_std::allocator<Dog_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(value->super__Vector_base<Dog_*,_std::allocator<Dog_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3);
      uVar2 = uVar2 + 1) {
    DukType<Dog>::push<Dog*,void>(ctx,ppDVar1[uVar2]);
    duk_put_prop_index(ctx,obj_idx,(duk_uarridx_t)uVar2);
  }
  return;
}

Assistant:

static void push(duk_context* ctx, const std::vector<T>& value) {
				duk_idx_t obj_idx = duk_push_array(ctx);

				for (size_t i = 0; i < value.size(); i++) {
					DukType< typename Bare<T>::type >::template push<T>(ctx, value[i]);
					duk_put_prop_index(ctx, obj_idx, i);
				}
			}